

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Writer.cpp
# Opt level: O2

void __thiscall OSTEI_HRR_Writer::WriteHRR_Bra_External_(OSTEI_HRR_Writer *this,ostream *os,QAM *am)

{
  _Type aiVar1;
  undefined8 uVar2;
  OSTEI_HRR_Algorithm_Base *pOVar3;
  RRStepType step;
  int iVar4;
  ostream *poVar5;
  _Base_ptr p_Var6;
  int local_188;
  int iStack_184;
  _Rb_tree<DAM,_DAM,_std::_Identity<DAM>,_std::less<DAM>,_std::allocator<DAM>_> local_178;
  char *local_148;
  size_type local_140;
  char local_138;
  undefined7 uStack_137;
  undefined8 uStack_130;
  char *local_128;
  size_type local_120;
  char local_118 [8];
  undefined8 uStack_110;
  char *local_108;
  size_type local_100;
  char local_f8 [8];
  undefined8 uStack_f0;
  undefined1 local_e8 [16];
  _Alloc_hider local_d8;
  size_type local_d0;
  char local_c8;
  undefined7 uStack_c7;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a0 [8];
  _Alloc_hider local_98;
  size_type local_90;
  char local_88 [16];
  undefined1 local_78 [8];
  _Alloc_hider local_70;
  size_type local_68;
  char local_60 [16];
  string local_50;
  
  pOVar3 = this->hrr_algo_;
  aiVar1 = *(_Type *)(am->qam)._M_elems;
  std::__cxx11::string::string((string *)&local_108,"",(allocator *)&local_178);
  local_70._M_p = local_60;
  if (local_108 == local_f8) {
    local_60[8] = (undefined1)uStack_f0;
    local_60[9] = uStack_f0._1_1_;
    local_60[10] = uStack_f0._2_1_;
    local_60[0xb] = uStack_f0._3_1_;
    local_60[0xc] = uStack_f0._4_1_;
    local_60[0xd] = uStack_f0._5_1_;
    local_60[0xe] = uStack_f0._6_1_;
    local_60[0xf] = uStack_f0._7_1_;
  }
  else {
    local_70._M_p = local_108;
  }
  local_68 = local_100;
  local_100 = 0;
  local_f8[0] = '\0';
  local_108 = local_f8;
  local_78 = (undefined1  [8])aiVar1;
  step = OSTEI_HRR_Algorithm_Base::GetBraRRStep(pOVar3,(DAM *)local_78);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_108);
  poVar5 = std::operator<<(os,(string *)&indent4_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"HRR_");
  RRStepTypeToStr_abi_cxx11_((string *)&local_178,step);
  poVar5 = std::operator<<(poVar5,(string *)&local_178);
  poVar5 = std::operator<<(poVar5,"_");
  poVar5 = std::operator<<(poVar5,"spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"
                                  [(am->qam)._M_elems[0]]);
  poVar5 = std::operator<<(poVar5,"_");
  poVar5 = std::operator<<(poVar5,"spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"
                                  [(am->qam)._M_elems[1]]);
  std::operator<<(poVar5,"(\n");
  std::__cxx11::string::~string((string *)&local_178);
  poVar5 = std::operator<<(os,(string *)&indent5_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"");
  HRRVarName_abi_cxx11_((string *)&local_178,am);
  poVar5 = std::operator<<(poVar5,(string *)&local_178);
  std::operator<<(poVar5,",\n");
  std::__cxx11::string::~string((string *)&local_178);
  pOVar3 = this->hrr_algo_;
  aiVar1 = *(_Type *)(am->qam)._M_elems;
  std::__cxx11::string::string((string *)&local_128,"",(allocator *)local_e8);
  local_98._M_p = local_88;
  if (local_128 == local_118) {
    local_88[8] = (undefined1)uStack_110;
    local_88[9] = uStack_110._1_1_;
    local_88[10] = uStack_110._2_1_;
    local_88[0xb] = uStack_110._3_1_;
    local_88[0xc] = uStack_110._4_1_;
    local_88[0xd] = uStack_110._5_1_;
    local_88[0xe] = uStack_110._6_1_;
    local_88[0xf] = uStack_110._7_1_;
  }
  else {
    local_98._M_p = local_128;
  }
  local_90 = local_120;
  local_120 = 0;
  local_118[0] = '\0';
  local_128 = local_118;
  local_a0 = (undefined1  [8])aiVar1;
  OSTEI_HRR_Algorithm_Base::GetBraAMReq((DAMSet *)&local_178,pOVar3,(DAM *)local_a0);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_128);
  for (p_Var6 = local_178._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &local_178._M_impl.super__Rb_tree_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    poVar5 = std::operator<<(os,(string *)&indent5_abi_cxx11_);
    poVar5 = std::operator<<(poVar5,"");
    uVar2 = *(undefined8 *)(p_Var6 + 1);
    local_b8 = *(undefined8 *)((am->qam)._M_elems + 2);
    uStack_b0 = 0;
    std::__cxx11::string::string((string *)&local_148,(string *)&am->tag);
    local_188 = (int)uVar2;
    iStack_184 = (int)((ulong)uVar2 >> 0x20);
    local_e8._8_4_ = (undefined4)local_b8;
    local_e8._12_4_ = (undefined4)((ulong)local_b8 >> 0x20);
    local_e8._0_4_ = local_188;
    local_e8._4_4_ = iStack_184;
    local_d8._M_p = &local_c8;
    if (local_148 == &local_138) {
      uStack_c0 = uStack_130;
    }
    else {
      local_d8._M_p = local_148;
    }
    uStack_c7 = uStack_137;
    local_c8 = local_138;
    local_d0 = local_140;
    local_140 = 0;
    local_138 = '\0';
    local_148 = &local_138;
    HRRVarName_abi_cxx11_(&local_50,(QAM *)local_e8);
    poVar5 = std::operator<<(poVar5,(string *)&local_50);
    std::operator<<(poVar5,",\n");
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_148);
  }
  std::_Rb_tree<DAM,_DAM,_std::_Identity<DAM>,_std::less<DAM>,_std::allocator<DAM>_>::~_Rb_tree
            (&local_178);
  poVar5 = std::operator<<(os,(string *)&indent5_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"hAB, ");
  iVar4 = NCART((am->qam)._M_elems[2],(am->qam)._M_elems[3]);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,iVar4);
  std::operator<<(poVar5,");\n");
  poVar5 = std::operator<<((ostream *)&std::cout,"SIMINT EXTERNAL HRR ");
  RRStepTypeToStr_abi_cxx11_((string *)&local_178,step);
  poVar5 = std::operator<<(poVar5,(string *)&local_178);
  poVar5 = std::operator<<(poVar5," ");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,(am->qam)._M_elems[0]);
  poVar5 = std::operator<<(poVar5," ");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,(am->qam)._M_elems[1]);
  std::operator<<(poVar5,"\n");
  std::__cxx11::string::~string((string *)&local_178);
  return;
}

Assistant:

void OSTEI_HRR_Writer::WriteHRR_Bra_External_(std::ostream & os, QAM am) const
{
    // call function
    RRStepType rrstep = hrr_algo_.GetBraRRStep({am[0], am[1]});
    os << indent4 << "HRR_" << RRStepTypeToStr(rrstep) << "_"
       << amchar[am[0]] << "_" << amchar[am[1]] << "(\n";

    // pointer to result buffer
    os << indent5 << "" << HRRVarName(am) << ",\n";

    // pointer to requirements
    for(const auto & it : hrr_algo_.GetBraAMReq({am[0], am[1]}))
        os << indent5 << "" << HRRVarName({it[0], it[1], am[2], am[3], am.tag}) << ",\n";

    os << indent5 << "hAB, " << NCART(am[2], am[3]) << ");\n"; 

    // Mark this as required in the log file
    std::cout << "SIMINT EXTERNAL HRR " << RRStepTypeToStr(rrstep)
              << " " << am[0] << " " << am[1] << "\n";
}